

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

double __thiscall TPZSkylMatrix<double>::GetVal(TPZSkylMatrix<double> *this,int64_t r,int64_t c)

{
  double **ppdVar1;
  int64_t index;
  long lVar2;
  int64_t col;
  int64_t row;
  
  ppdVar1 = (this->fElem).fStore;
  lVar2 = r - c;
  if (lVar2 == 0 || r < c) {
    lVar2 = c - r;
    r = c;
    if ((long)ppdVar1[c + 1] - (long)ppdVar1[c] >> 3 <= lVar2) {
      return 0.0;
    }
  }
  else if ((long)ppdVar1[r + 1] - (long)ppdVar1[r] >> 3 <= lVar2) {
    return 0.0;
  }
  return (this->fElem).fStore[r][lVar2];
}

Assistant:

const TVar
TPZSkylMatrix<TVar>::GetVal(const int64_t r,const int64_t c ) const
{
	// inicializando row e col para trabalhar com a triangular superior
	int64_t row(r),col(c);
	if ( row > col ){
		this->Swap( &row, &col );
        const int64_t index   = col - row;
        if ( index < Size(col) ){
            if constexpr (is_complex<TVar>::value){
                return( std::conj(fElem[col][index]) );
            }else{
                return( fElem[col][index] );
            }
        }else{
            return (TVar)0;
        }
    }
	const int64_t index   = col - row;
	if ( index < Size(col) )
		return( fElem[col][index] );
	else {
		return (TVar) 0;
    }

}